

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMLSParserImpl::startElement
          (DOMLSParserImpl *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  bool bVar1;
  FilterAction *pFVar2;
  ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *this_00;
  DOMLSException *this_01;
  DOMNode *pDVar3;
  FilterAction action;
  XMLCh *local_40;
  FilterAction local_34;
  
  local_40 = elemPrefix;
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) {
    bVar1 = ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::containsKey
                      (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
    if (bVar1) {
      ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeKey
                (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
      applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
    }
  }
  pDVar3 = (this->super_AbstractDOMParser).fCurrentParent;
  AbstractDOMParser::startElement
            (&this->super_AbstractDOMParser,elemDecl,urlId,local_40,attrList,attrCount,false,isRoot)
  ;
  if (this->fFilter == (DOMLSParserFilter *)0x0) goto LAB_002d9852;
  if (this->fFilterAction ==
      (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0)
  {
LAB_002d97e3:
    action = (*this->fFilter->_vptr_DOMLSParserFilter[3])
                       (this->fFilter,(this->super_AbstractDOMParser).fCurrentNode);
    if (1 < action - FILTER_REJECT) {
      if (action == FILTER_INTERRUPT) {
        this_01 = (DOMLSException *)__cxa_allocate_exception(0x28);
        DOMLSException::DOMLSException
                  (this_01,0x51,0x22,(this->super_AbstractDOMParser).fMemoryManager);
        __cxa_throw(this_01,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
      }
      goto LAB_002d9852;
    }
    this_00 = this->fFilterAction;
    if (this_00 ==
        (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)
        0x0) {
      this_00 = (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                 *)XMemory::operator_new(0x30,(this->super_AbstractDOMParser).fMemoryManager);
      ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
      ValueHashTableOf(this_00,7,(this->super_AbstractDOMParser).fMemoryManager);
      this->fFilterAction = this_00;
    }
    pDVar3 = (this->super_AbstractDOMParser).fCurrentNode;
    pFVar2 = &action;
  }
  else {
    bVar1 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
            containsKey(this->fFilterAction,pDVar3);
    if (!bVar1) goto LAB_002d97e3;
    pFVar2 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
             ::get(this->fFilterAction,pDVar3,XMLPlatformUtils::fgMemoryManager);
    if (*pFVar2 != FILTER_REJECT) goto LAB_002d97e3;
    pDVar3 = (this->super_AbstractDOMParser).fCurrentNode;
    this_00 = this->fFilterAction;
    pFVar2 = &local_34;
    local_34 = FILTER_REJECT;
  }
  ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::put
            (this_00,pDVar3,pFVar2);
LAB_002d9852:
  if (isEmpty) {
    (*(this->super_AbstractDOMParser).super_XMLDocumentHandler._vptr_XMLDocumentHandler[6])
              (this,elemDecl,(ulong)urlId,(ulong)isRoot,local_40);
  }
  return;
}

Assistant:

void DOMLSParserImpl::startElement(const XMLElementDecl&         elemDecl
                                 , const unsigned int            urlId
                                 , const XMLCh* const            elemPrefix
                                 , const RefVectorOf<XMLAttr>&   attrList
                                 , const XMLSize_t               attrCount
                                 , const bool                    isEmpty
                                 , const bool                    isRoot)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    DOMNode* origParent = fCurrentParent;
    AbstractDOMParser::startElement(elemDecl, urlId, elemPrefix, attrList, attrCount, false, isRoot);
    if(fFilter)
    {
        // if the parent was already rejected, reject this too
        if(fFilterAction && fFilterAction->containsKey(origParent) && fFilterAction->get(origParent)==DOMLSParserFilter::FILTER_REJECT)
            fFilterAction->put(fCurrentNode, DOMLSParserFilter::FILTER_REJECT);
        else
        {
            DOMLSParserFilter::FilterAction action = fFilter->startElement((DOMElement*)fCurrentNode);

            switch(action)
            {
            case DOMLSParserFilter::FILTER_ACCEPT:      break;
            case DOMLSParserFilter::FILTER_REJECT:
            case DOMLSParserFilter::FILTER_SKIP:        if(fFilterAction==0)
                                                            fFilterAction=new (fMemoryManager) ValueHashTableOf<DOMLSParserFilter::FilterAction, PtrHasher>(7, fMemoryManager);
                                                        fFilterAction->put(fCurrentNode, action);
                                                        break;
            case DOMLSParserFilter::FILTER_INTERRUPT:   throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingAborted, fMemoryManager);
            }
        }
    }
    if(isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}